

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O3

Result * validateTrainingInputs<CoreML::Specification::NeuralNetworkRegressor>
                   (Result *__return_storage_ptr__,ModelDescription *modelDescription,
                   NeuralNetworkRegressor *nn)

{
  int iVar1;
  pointer pcVar2;
  long lVar3;
  bool bVar4;
  Type *a;
  Type *b;
  LogMessage *pLVar5;
  string *extraout_RAX;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined7 extraout_var;
  string *psVar6;
  undefined4 extraout_var_02;
  undefined8 *puVar7;
  long *plVar8;
  long *plVar9;
  NetworkUpdateParameters *pNVar10;
  NeuralNetworkRegressor *pNVar11;
  long lVar12;
  long lVar13;
  FeatureType *b_00;
  char *pcVar14;
  FeatureType *pFVar15;
  int iVar16;
  size_type *psVar17;
  string trainingInputTarget;
  string err;
  vector<int,_std::allocator<int>_> trainingInputExclusiveIndices;
  string typeString;
  string targetTypeString;
  string target;
  Result r;
  undefined1 local_228 [56];
  string local_1f0;
  Result *local_1d0;
  int *local_1c8;
  iterator iStack_1c0;
  int *local_1b8;
  string *local_1a8;
  NeuralNetworkRegressor *local_1a0;
  long *local_198 [2];
  long local_188 [2];
  Type *local_178;
  long local_170;
  RepeatedPtrFieldBase *local_168;
  long *local_160;
  long local_158;
  long local_150;
  long lStack_148;
  long *local_140;
  long local_138;
  long local_130;
  long lStack_128;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  long *local_e0 [2];
  long local_d0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  pointer local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Result local_58;
  
  CoreML::Result::Result(&local_58);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  if ((modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    std::__cxx11::string::_M_replace((ulong)&local_1f0,0,(char *)0x0,0x312ba0);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_1f0);
    goto LAB_0028a703;
  }
  local_1c8 = (int *)0x0;
  iStack_1c0._M_current = (int *)0x0;
  local_1b8 = (int *)0x0;
  local_228._0_8_ = local_228._0_8_ & 0xffffffff00000000;
  local_168 = &(modelDescription->traininginput_).super_RepeatedPtrFieldBase;
  iVar16 = 0;
  local_1d0 = __return_storage_ptr__;
  local_1a0 = nn;
  do {
    a = google::protobuf::internal::RepeatedPtrFieldBase::
        Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                  (local_168,iVar16);
    if (0 < (modelDescription->input_).super_RepeatedPtrFieldBase.current_size_) {
      iVar16 = 0;
      do {
        b = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                      (&(modelDescription->input_).super_RepeatedPtrFieldBase,iVar16);
        bVar4 = CoreML::Specification::isEquivalent(a,b);
        if (bVar4) goto LAB_00289dc5;
        iVar16 = iVar16 + 1;
      } while (iVar16 < (modelDescription->input_).super_RepeatedPtrFieldBase.current_size_);
    }
    if (iStack_1c0._M_current == local_1b8) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_1c8,iStack_1c0,(int *)local_228);
    }
    else {
      *iStack_1c0._M_current = local_228._0_4_;
      iStack_1c0._M_current = iStack_1c0._M_current + 1;
    }
LAB_00289dc5:
    pNVar11 = local_1a0;
    __return_storage_ptr__ = local_1d0;
    iVar16 = local_228._0_4_ + LOGLEVEL_WARNING;
    local_228._0_4_ = iVar16;
    iVar1 = (modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_;
  } while (iVar16 < iVar1);
  if ((long)iStack_1c0._M_current - (long)local_1c8 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_1f0,0,(char *)local_1f0._M_string_length,0x312c0f);
    __return_storage_ptr__ = local_1d0;
    CoreML::Result::Result(local_1d0,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_1f0);
  }
  else if ((long)iStack_1c0._M_current - (long)local_1c8 >> 2 == (long)iVar1) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_1f0,0,(char *)local_1f0._M_string_length,0x312c72);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_1f0);
  }
  else {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_c0._M_string_length = 0;
    local_c0.field_2._M_local_buf[0] = '\0';
    pNVar10 = local_1a0->updateparams_;
    if (pNVar10 == (NetworkUpdateParameters *)0x0) {
      pNVar10 = (NetworkUpdateParameters *)
                &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
    }
    if ((pNVar10->losslayers_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_228,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<
                         ((LogMessage *)local_228,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_198,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_228);
    }
    iVar16 = *(int *)((long)((pNVar10->losslayers_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                     0x24);
    iVar1 = (pNVar10->losslayers_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar16 == 10) {
      if (iVar1 < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_228,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar5 = google::protobuf::internal::LogMessage::operator<<
                           ((LogMessage *)local_228,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_198,pLVar5);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_228);
        if (*(int *)((long)((pNVar10->losslayers_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                    0x24) != 10) {
          CoreML::Specification::CategoricalCrossEntropyLossLayer::default_instance();
        }
      }
LAB_0028a003:
      std::__cxx11::string::_M_assign((string *)&local_c0);
    }
    else {
      if (iVar1 < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_228,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar5 = google::protobuf::internal::LogMessage::operator<<
                           ((LogMessage *)local_228,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_198,pLVar5);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_228);
        iVar16 = *(int *)((long)((pNVar10->losslayers_).super_RepeatedPtrFieldBase.rep_)->elements
                                [0] + 0x24);
      }
      if (iVar16 == 0xb) {
        if ((pNVar10->losslayers_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_228,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar5 = google::protobuf::internal::LogMessage::operator<<
                             ((LogMessage *)local_228,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_198,pLVar5);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_228);
          if (*(int *)((long)((pNVar10->losslayers_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                      0x24) != 0xb) {
            CoreML::Specification::MeanSquaredErrorLossLayer::default_instance();
          }
        }
        goto LAB_0028a003;
      }
    }
    local_170 = __dynamic_cast(pNVar11,&CoreML::Specification::NeuralNetworkRegressor::typeinfo,
                               &CoreML::Specification::NeuralNetworkClassifier::typeinfo,
                               0xfffffffffffffffe);
    if (iStack_1c0._M_current == local_1c8) {
LAB_0028a654:
      if (local_170 == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_228,"The training inputs don\'t include the loss layer\'s target: ",
                       &local_c0);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_228,"The training inputs don\'t include the target of the classifier: "
                       ,(modelDescription->predictedfeaturename_).ptr_);
      }
      std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_228);
      if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
        operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
      }
      CoreML::Result::Result
                (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_1f0);
    }
    else {
      pNVar11 = (NeuralNetworkRegressor *)0x0;
      local_1a8 = (string *)0x0;
      do {
        local_178 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                              (local_168,local_1c8[(long)pNVar11]);
        psVar6 = (local_178->name_).ptr_;
        pcVar2 = (psVar6->_M_dataplus)._M_p;
        local_228._0_8_ = local_228 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_228,pcVar2,pcVar2 + psVar6->_M_string_length);
        pcVar14 = (char *)local_228._8_8_;
        psVar6 = extraout_RAX;
        local_1a0 = pNVar11;
        if ((local_170 != 0) &&
           (psVar6 = (modelDescription->predictedfeaturename_).ptr_,
           (char *)local_228._8_8_ == (char *)psVar6->_M_string_length)) {
          if ((char *)local_228._8_8_ != (char *)0x0) {
            iVar16 = bcmp((void *)local_228._0_8_,(psVar6->_M_dataplus)._M_p,local_228._8_8_);
            psVar6 = (string *)CONCAT44(extraout_var_00,iVar16);
            if (iVar16 != 0) goto LAB_0028a196;
          }
          psVar6 = (string *)(modelDescription->output_).super_RepeatedPtrFieldBase.rep_;
          psVar17 = &psVar6->_M_string_length;
          if (psVar6 == (string *)0x0) {
            psVar17 = (size_type *)0x0;
          }
          lVar12 = (long)(modelDescription->output_).super_RepeatedPtrFieldBase.current_size_;
          if (lVar12 != 0) {
            local_a0 = (pointer)local_228._0_8_;
            lVar13 = 0;
            do {
              lVar3 = *(long *)((long)psVar17 + lVar13);
              psVar6 = *(string **)(lVar3 + 0x10);
              if (pcVar14 == (char *)psVar6->_M_string_length) {
                if (pcVar14 != (char *)0x0) {
                  iVar16 = bcmp(local_a0,(psVar6->_M_dataplus)._M_p,(size_t)pcVar14);
                  psVar6 = (string *)CONCAT44(extraout_var_01,iVar16);
                  if (iVar16 != 0) goto LAB_0028a129;
                }
                pFVar15 = local_178->type_;
                if (pFVar15 == (FeatureType *)0x0) {
                  pFVar15 = (FeatureType *)&CoreML::Specification::_FeatureType_default_instance_;
                }
                b_00 = *(FeatureType **)(lVar3 + 0x20);
                if (b_00 == (FeatureType *)0x0) {
                  b_00 = (FeatureType *)&CoreML::Specification::_FeatureType_default_instance_;
                }
                bVar4 = CoreML::Specification::operator==(pFVar15,b_00);
                __return_storage_ptr__ = local_1d0;
                if (!bVar4) {
                  puVar7 = *(undefined8 **)(lVar3 + 0x20);
                  if (puVar7 == (undefined8 *)0x0) {
                    puVar7 = &CoreML::Specification::_FeatureType_default_instance_;
                  }
                  bVar4 = *(int *)((long)puVar7 + 0x24) == 1;
                  pcVar14 = "String";
                  if (bVar4) {
                    pcVar14 = "Int64";
                  }
                  local_198[0] = local_188;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_198,pcVar14,pcVar14 + (6 - (ulong)bVar4));
                  pFVar15 = local_178->type_;
                  if (pFVar15 == (FeatureType *)0x0) {
                    pFVar15 = (FeatureType *)&CoreML::Specification::_FeatureType_default_instance_;
                  }
                  bVar4 = pFVar15->_oneof_case_[0] == 1;
                  pcVar14 = "String";
                  if (bVar4) {
                    pcVar14 = "Int64";
                  }
                  local_e0[0] = local_d0;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_e0,pcVar14,pcVar14 + (6 - (ulong)bVar4));
                  std::operator+(&local_78,"The type of the training input provided: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_228);
                  plVar8 = (long *)std::__cxx11::string::append((char *)&local_78);
                  plVar9 = plVar8 + 2;
                  if ((long *)*plVar8 == plVar9) {
                    local_f0 = *plVar9;
                    lStack_e8 = plVar8[3];
                    local_100 = &local_f0;
                  }
                  else {
                    local_f0 = *plVar9;
                    local_100 = (long *)*plVar8;
                  }
                  local_f8 = plVar8[1];
                  *plVar8 = (long)plVar9;
                  plVar8[1] = 0;
                  *(undefined1 *)(plVar8 + 2) = 0;
                  plVar8 = (long *)std::__cxx11::string::_M_append
                                             ((char *)&local_100,(ulong)local_e0[0]);
                  local_160 = &local_150;
                  plVar9 = plVar8 + 2;
                  if ((long *)*plVar8 == plVar9) {
                    local_150 = *plVar9;
                    lStack_148 = plVar8[3];
                  }
                  else {
                    local_150 = *plVar9;
                    local_160 = (long *)*plVar8;
                  }
                  local_158 = plVar8[1];
                  *plVar8 = (long)plVar9;
                  plVar8[1] = 0;
                  *(undefined1 *)(plVar8 + 2) = 0;
                  plVar8 = (long *)std::__cxx11::string::append((char *)&local_160);
                  local_140 = &local_130;
                  plVar9 = plVar8 + 2;
                  if ((long *)*plVar8 == plVar9) {
                    local_130 = *plVar9;
                    lStack_128 = plVar8[3];
                  }
                  else {
                    local_130 = *plVar9;
                    local_140 = (long *)*plVar8;
                  }
                  local_138 = plVar8[1];
                  *plVar8 = (long)plVar9;
                  plVar8[1] = 0;
                  *(undefined1 *)(plVar8 + 2) = 0;
                  plVar8 = (long *)std::__cxx11::string::_M_append
                                             ((char *)&local_140,(ulong)local_198[0]);
                  local_120 = &local_110;
                  plVar9 = plVar8 + 2;
                  if ((long *)*plVar8 == plVar9) {
                    local_110 = *plVar9;
                    lStack_108 = plVar8[3];
                  }
                  else {
                    local_110 = *plVar9;
                    local_120 = (long *)*plVar8;
                  }
                  local_118 = plVar8[1];
                  *plVar8 = (long)plVar9;
                  plVar8[1] = 0;
                  *(undefined1 *)(plVar8 + 2) = 0;
                  plVar8 = (long *)std::__cxx11::string::append((char *)&local_120);
                  plVar9 = plVar8 + 2;
                  if ((long *)*plVar8 == plVar9) {
                    local_88 = *plVar9;
                    lStack_80 = plVar8[3];
                    local_98 = &local_88;
                  }
                  else {
                    local_88 = *plVar9;
                    local_98 = (long *)*plVar8;
                  }
                  local_90 = plVar8[1];
                  *plVar8 = (long)plVar9;
                  plVar8[1] = 0;
                  *(undefined1 *)(plVar8 + 2) = 0;
                  std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_98);
                  if (local_98 != &local_88) {
                    operator_delete(local_98,local_88 + 1);
                  }
                  if (local_120 != &local_110) {
                    operator_delete(local_120,local_110 + 1);
                  }
                  if (local_140 != &local_130) {
                    operator_delete(local_140,local_130 + 1);
                  }
                  if (local_160 != &local_150) {
                    operator_delete(local_160,local_150 + 1);
                  }
                  if (local_100 != &local_f0) {
                    operator_delete(local_100,local_f0 + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_78._M_dataplus._M_p != &local_78.field_2) {
                    operator_delete(local_78._M_dataplus._M_p,
                                    local_78.field_2._M_allocated_capacity + 1);
                  }
                  CoreML::Result::Result
                            (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_1f0
                            );
                  if (local_e0[0] != local_d0) {
                    operator_delete(local_e0[0],local_d0[0] + 1);
                  }
                  if (local_198[0] != local_188) {
                    operator_delete(local_198[0],local_188[0] + 1);
                  }
                  bVar4 = false;
                  goto LAB_0028a1cb;
                }
                psVar6 = (string *)CONCAT71(extraout_var,1);
                pcVar14 = (char *)local_228._8_8_;
                local_1a8 = psVar6;
                break;
              }
LAB_0028a129:
              lVar13 = lVar13 + 8;
              __return_storage_ptr__ = local_1d0;
            } while (lVar12 * 8 != lVar13);
          }
        }
LAB_0028a196:
        bVar4 = true;
        if ((char *)local_c0._M_string_length == pcVar14) {
          if (pcVar14 != (char *)0x0) {
            iVar16 = bcmp(local_c0._M_dataplus._M_p,(void *)local_228._0_8_,(size_t)pcVar14);
            psVar6 = (string *)CONCAT44(extraout_var_02,iVar16);
            if (iVar16 != 0) goto LAB_0028a1cb;
          }
          local_1a8 = (string *)CONCAT71((int7)((ulong)psVar6 >> 8),1);
          bVar4 = true;
        }
LAB_0028a1cb:
        if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
          operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
        }
        if (!bVar4) goto LAB_0028a6c7;
        pNVar11 = (NeuralNetworkRegressor *)
                  ((long)&(local_1a0->super_MessageLite)._vptr_MessageLite + 1);
      } while (pNVar11 < (NeuralNetworkRegressor *)
                         ((long)iStack_1c0._M_current - (long)local_1c8 >> 2));
      if (((ulong)local_1a8 & 1) == 0) goto LAB_0028a654;
      CoreML::Result::Result(__return_storage_ptr__);
    }
LAB_0028a6c7:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
  }
  if (local_1c8 != (int *)0x0) {
    operator_delete(local_1c8,(long)local_1b8 - (long)local_1c8);
  }
LAB_0028a703:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                             local_1f0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_message._M_dataplus._M_p != &local_58.m_message.field_2) {
    operator_delete(local_58.m_message._M_dataplus._M_p,
                    local_58.m_message.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateTrainingInputs(const Specification::ModelDescription& modelDescription, const T& nn) {
    Result r;
    std::string err;

    if (modelDescription.traininginput_size() <= 1) {
        err = "Must provide training inputs for updatable neural network (expecting both input and target for loss function).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    std::vector<int> trainingInputExclusiveIndices;
    for (int i = 0; i < modelDescription.traininginput_size(); i++) {
        const Specification::FeatureDescription& trainingInput = modelDescription.traininginput(i);
        bool trainingInputIsPredictionInput = false;
        for (int j = 0; j < modelDescription.input_size(); j++) {
            const Specification::FeatureDescription& input = modelDescription.input(j);
            if (Specification::isEquivalent(trainingInput, input)) {
                trainingInputIsPredictionInput = true;
                break;
            }
        }
        if (!trainingInputIsPredictionInput) {
            trainingInputExclusiveIndices.push_back(i);
        }
    }

    // Check that training inputs are specified to at least contain the target (which we'll validate is the target further down)
    if (trainingInputExclusiveIndices.size() < 1) {
        err = "Training inputs don't describe required inputs for the loss (needs both the input and the target).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    // Ensure other inputs (excluding the target) are present
    // This should prevent issues where the only training input described is the target itself
    // Given we don't yet know what inputs are explicitly required for training we can't vet beyond this for what model inputs to require
    size_t numberOfNonExclusiveTrainingInputs = static_cast<size_t>(modelDescription.traininginput_size()) - trainingInputExclusiveIndices.size();
    if (numberOfNonExclusiveTrainingInputs <= 0) { // Given at least one input from the inference model's inputs must be supplied this should be positive
        err = "The training inputs must include at least one input from the model itself as required for training (should have at least one input in common with those used for prediction).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    std::string target;
    const Specification::NetworkUpdateParameters& updateParams = nn.updateparams();
    if (updateParams.losslayers(0).has_categoricalcrossentropylosslayer()) {
        target = updateParams.losslayers(0).categoricalcrossentropylosslayer().target();
    } else if (updateParams.losslayers(0).has_meansquarederrorlosslayer()) {
        target = updateParams.losslayers(0).meansquarederrorlosslayer().target();
    }

    bool isClassifier = (dynamic_cast<const Specification::NeuralNetworkClassifier*>(&nn) != nullptr);

    bool trainingInputMeetsRequirement = false;
    for (size_t i = 0; i < trainingInputExclusiveIndices.size(); i++) {
        const Specification::FeatureDescription& trainingInputDescription = modelDescription.traininginput(trainingInputExclusiveIndices[i]);
        std::string trainingInputTarget = trainingInputDescription.name();

        // If the neural network is a classifier, check if the predictedFeatureNames is a training input (and ensure matching types)
        if (isClassifier) {
            if (trainingInputTarget == modelDescription.predictedfeaturename()) {

                // Find the predictedFeatureName's output and use to check types
                for (const auto& output : modelDescription.output()) {
                    if (trainingInputTarget == output.name()) {
                        if (trainingInputDescription.type() == output.type()) {
                            trainingInputMeetsRequirement = true;
                            break;
                        } else {
                            std::string typeString = output.type().has_int64type() ? "Int64" : "String";
                            std::string targetTypeString = trainingInputDescription.type().has_int64type() ? "Int64" : "String";
                            err = "The type of the training input provided: " + trainingInputTarget + " doesn't match the expected type of the classifier. Found: " + targetTypeString + ", expected: " + typeString + ".";
                            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
                        }
                    }
                }
            }
        }

        // If NN was not a classifier (or predictedFeatureName was not in the training inputs), ensure the target is in the training inputs
        if (target == trainingInputTarget) {
            trainingInputMeetsRequirement = true;
        }
    }

    // Raise an error if the target isn't found (or if the target or predictedFeatureNames aren't found for classifiers)
    // Users can supply either / or for a classifier, but if neither is found we'll request the predictedFeatureNames
    if (!trainingInputMeetsRequirement) {
        if (isClassifier) {
            err = "The training inputs don't include the target of the classifier: " + modelDescription.predictedfeaturename();
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
        err = "The training inputs don't include the loss layer's target: " + target;
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    return Result();
}